

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isastubs.c
# Opt level: O0

parasail_result_t *
parasail_sg_qb_de_trace_striped_profile_neon_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  
  piVar1 = __errno_location();
  *piVar1 = 0x26;
  return (parasail_result_t *)0x0;
}

Assistant:

extern
parasail_result_t* parasail_sg_qb_de_trace_striped_profile_neon_128_32(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    UNUSED(profile);
    UNUSED(s2);
    UNUSED(s2Len);
    UNUSED(open);
    UNUSED(gap);
    errno = ENOSYS;
    return NULL;
}